

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat.cpp
# Opt level: O1

uint64_t EncodeDouble(double f)

{
  char cVar1;
  ulong uVar2;
  uint64_t uVar3;
  long in_FS_OFFSET;
  double dVar4;
  int exp;
  int local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = '\x02';
  if ((f != 0.0) || (NAN(f))) {
    if (NAN(f)) {
      cVar1 = '\0';
    }
    else {
      cVar1 = '\x01';
      if (ABS(f) != INFINITY) {
        cVar1 = (2.2250738585072014e-308 <= ABS(f)) + '\x03';
      }
    }
  }
  if (cVar1 == '\0') {
    uVar3 = 0x7ff8000000000000;
    goto LAB_00e1c850;
  }
  dVar4 = (double)((ulong)f & 0x8000000000000000 | (ulong)DAT_01179f40);
  uVar3 = -(ulong)(dVar4 == -1.0) << 0x3f;
  if (cVar1 == '\x02') goto LAB_00e1c850;
  if (cVar1 == '\x01') {
LAB_00e1c837:
    uVar2 = 0x7ff0000000000000;
  }
  else {
    uVar2 = -(ulong)(dVar4 == -1.0);
    dVar4 = frexp((double)(~uVar2 & (ulong)f | (ulong)-f & uVar2),&local_1c);
    dVar4 = round(dVar4 * 9007199254740992.0);
    uVar2 = (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4;
    if (local_1c < -0x3fd) {
      if (local_1c < -0x43c) goto LAB_00e1c850;
      uVar2 = uVar2 >> (3U - (char)local_1c & 0x3f);
    }
    else {
      if (0x400 < local_1c) goto LAB_00e1c837;
      uVar2 = uVar2 & 0xfffffffffffff | (ulong)(local_1c + 0x3fe) << 0x34;
    }
  }
  uVar3 = uVar3 | uVar2;
LAB_00e1c850:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t EncodeDouble(double f) noexcept {
    int cls = std::fpclassify(f);
    uint64_t sign = 0;
    if (copysign(1.0, f) == -1.0) {
        f = -f;
        sign = 0x8000000000000000;
    }
    // Zero
    if (cls == FP_ZERO) return sign;
    // Infinity
    if (cls == FP_INFINITE) return sign | 0x7ff0000000000000;
    // NaN
    if (cls == FP_NAN) return 0x7ff8000000000000;
    // Other numbers
    int exp;
    uint64_t man = std::round(std::frexp(f, &exp) * 9007199254740992.0);
    if (exp < -1021) {
        // Too small to represent, encode 0
        if (exp < -1084) return sign;
        // Subnormal numbers
        return sign | (man >> (-1021 - exp));
    } else {
        // Too big to represent, encode infinity
        if (exp > 1024) return sign | 0x7ff0000000000000;
        // Normal numbers
        return sign | (((uint64_t)(1022 + exp)) << 52) | (man & 0xFFFFFFFFFFFFF);
    }
}